

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::addGlobalImport(Wasm2JSBuilder *this,Ref ast,Global *import)

{
  bool bVar1;
  Ref r;
  Value *this_00;
  Ref in_R8;
  IString IVar2;
  IString name;
  Ref local_70;
  char *local_68;
  BasicType local_44;
  Ref local_40;
  Ref value;
  Ref theVar;
  Global *import_local;
  Wasm2JSBuilder *this_local;
  Ref ast_local;
  
  this_local = (Wasm2JSBuilder *)ast.inst;
  ensureModuleVar(this,ast,&import->super_Importable);
  r = cashew::ValueBuilder::makeVar(false);
  this_00 = cashew::Ref::operator->((Ref *)&this_local);
  value.inst = r.inst;
  cashew::Value::push_back(this_00,r);
  local_40 = getImportName(this,&import->super_Importable);
  local_44 = i32;
  bVar1 = Type::operator==(&import->type,&local_44);
  if (bVar1) {
    local_40.inst = (Value *)makeJsCoercion(local_40,JS_INT);
  }
  IVar2 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
  local_70.inst = (Value *)IVar2.str._M_len;
  local_68 = IVar2.str._M_str;
  name.str._M_str = (char *)local_40.inst;
  name.str._M_len = (size_t)local_68;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,local_70,name,in_R8);
  return;
}

Assistant:

void Wasm2JSBuilder::addGlobalImport(Ref ast, Global* import) {
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  Ref value = getImportName(*import);
  if (import->type == Type::i32) {
    value = makeJsCoercion(value, JS_INT);
  }
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), value);
}